

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::ScrollIntoView(Element *this,ScrollIntoViewOptions options)

{
  Overflow OVar1;
  ComputedValues *this_00;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  Vector2f rhs;
  Vector2f rhs_00;
  Vector2<float> VVar6;
  float local_100;
  float local_f8;
  Vector2<float> local_b8;
  Vector2f scroll_delta;
  Vector2<float> local_a0;
  Vector2<float> local_98;
  Vector2f delta_scroll_offset_end;
  Vector2<float> local_84;
  Vector2f delta_scroll_offset_start;
  Vector2f parent_client_offset;
  Vector2f old_scroll_offset;
  Vector2f local_64;
  Vector2<float> local_5c;
  Vector2f relative_offset;
  Vector2f parent_client_size;
  Vector2f parent_scroll_size;
  bool scrollable_box_y;
  bool scrollable_box_x;
  ComputedValues *computed;
  Element *scroll_parent;
  ScrollBehavior scroll_behavior;
  Vector2f size;
  Element *this_local;
  ScrollIntoViewOptions options_local;
  
  rhs = Box::GetSize(&this->main_box,Border);
  options_local.vertical = options.behavior;
  scroll_parent._4_4_ = options_local.vertical;
  computed = (ComputedValues *)this->parent;
  while( true ) {
    if (computed == (ComputedValues *)0x0) {
      return;
    }
    this_00 = GetComputedValues((Element *)computed);
    OVar1 = Style::ComputedValues::overflow_x(this_00);
    bVar2 = false;
    if (OVar1 != Visible) {
      OVar1 = Style::ComputedValues::overflow_x(this_00);
      bVar2 = OVar1 != Hidden;
    }
    OVar1 = Style::ComputedValues::overflow_y(this_00);
    bVar3 = false;
    if (OVar1 != Visible) {
      OVar1 = Style::ComputedValues::overflow_y(this_00);
      bVar3 = OVar1 != Hidden;
    }
    fVar4 = GetScrollWidth((Element *)computed);
    fVar5 = GetScrollHeight((Element *)computed);
    Vector2<float>::Vector2(&parent_client_size,fVar4,fVar5);
    fVar4 = GetClientWidth((Element *)computed);
    fVar5 = GetClientHeight((Element *)computed);
    Vector2<float>::Vector2(&relative_offset,fVar4,fVar5);
    if (((bVar2) && (relative_offset.x < parent_client_size.x)) ||
       ((bVar3 && (relative_offset.y < parent_client_size.y)))) {
      local_64 = GetAbsoluteOffset((Element *)computed,Border);
      rhs_00 = GetAbsoluteOffset(this,Border);
      local_5c = Vector2<float>::operator-(&local_64,rhs_00);
      fVar4 = GetScrollLeft((Element *)computed);
      fVar5 = GetScrollTop((Element *)computed);
      Vector2<float>::Vector2(&parent_client_offset,fVar4,fVar5);
      fVar4 = GetClientLeft((Element *)computed);
      fVar5 = GetClientTop((Element *)computed);
      Vector2<float>::Vector2(&delta_scroll_offset_start,fVar4,fVar5);
      delta_scroll_offset_end.x = local_5c.x;
      delta_scroll_offset_end.y = local_5c.y;
      local_84 = Vector2<float>::operator-(&delta_scroll_offset_start,local_5c);
      local_a0 = Vector2<float>::operator+(&local_84,rhs);
      VVar6.y = relative_offset.y;
      VVar6.x = relative_offset.x;
      local_98 = Vector2<float>::operator-(&local_a0,VVar6);
      if (bVar2) {
        this_local._4_4_ = options.horizontal;
        local_f8 = GetScrollOffsetDelta(this_local._4_4_,local_84.x,local_98.x);
      }
      else {
        local_f8 = 0.0;
      }
      if (bVar3) {
        this_local._0_4_ = options.vertical;
        local_100 = GetScrollOffsetDelta((ScrollAlignment)this_local,local_84.y,local_98.y);
      }
      else {
        local_100 = 0.0;
      }
      Vector2<float>::Vector2(&local_b8,local_f8,local_100);
      VVar6 = Vector2<float>::operator+(&parent_client_offset,local_b8);
      ScrollTo((Element *)computed,VVar6,scroll_parent._4_4_);
      scroll_parent._4_4_ = Instant;
    }
    if (((bVar2) || (bVar3)) &&
       (options_local.horizontal = options.parentage, options_local.horizontal == Center)) break;
    computed = (ComputedValues *)GetParentNode((Element *)computed);
  }
  return;
}

Assistant:

void Element::ScrollIntoView(const ScrollIntoViewOptions options)
{
	const Vector2f size = main_box.GetSize(BoxArea::Border);
	ScrollBehavior scroll_behavior = options.behavior;

	for (Element* scroll_parent = parent; scroll_parent; scroll_parent = scroll_parent->GetParentNode())
	{
		using Style::Overflow;
		const ComputedValues& computed = scroll_parent->GetComputedValues();
		const bool scrollable_box_x = (computed.overflow_x() != Overflow::Visible && computed.overflow_x() != Overflow::Hidden);
		const bool scrollable_box_y = (computed.overflow_y() != Overflow::Visible && computed.overflow_y() != Overflow::Hidden);

		const Vector2f parent_scroll_size = {scroll_parent->GetScrollWidth(), scroll_parent->GetScrollHeight()};
		const Vector2f parent_client_size = {scroll_parent->GetClientWidth(), scroll_parent->GetClientHeight()};

		if ((scrollable_box_x && parent_scroll_size.x > parent_client_size.x) || (scrollable_box_y && parent_scroll_size.y > parent_client_size.y))
		{
			const Vector2f relative_offset = scroll_parent->GetAbsoluteOffset(BoxArea::Border) - GetAbsoluteOffset(BoxArea::Border);

			const Vector2f old_scroll_offset = {scroll_parent->GetScrollLeft(), scroll_parent->GetScrollTop()};
			const Vector2f parent_client_offset = {scroll_parent->GetClientLeft(), scroll_parent->GetClientTop()};

			const Vector2f delta_scroll_offset_start = parent_client_offset - relative_offset;
			const Vector2f delta_scroll_offset_end = delta_scroll_offset_start + size - parent_client_size;

			Vector2f scroll_delta = {
				scrollable_box_x ? GetScrollOffsetDelta(options.horizontal, delta_scroll_offset_start.x, delta_scroll_offset_end.x) : 0.f,
				scrollable_box_y ? GetScrollOffsetDelta(options.vertical, delta_scroll_offset_start.y, delta_scroll_offset_end.y) : 0.f,
			};

			scroll_parent->ScrollTo(old_scroll_offset + scroll_delta, scroll_behavior);

			// Currently, only a single scrollable parent can be smooth scrolled at a time, so any other parents must be instant scrolled.
			scroll_behavior = ScrollBehavior::Instant;
		}

		if ((scrollable_box_x || scrollable_box_y) && options.parentage == ScrollParentage::Closest)
			break;
	}
}